

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void lj_state_growstack(lua_State *L,MSize need)

{
  uint uVar1;
  MSize n;
  
  uVar1 = L->stacksize;
  if (0xffe4 < uVar1) {
    lj_err_throw(L,5);
  }
  n = need + uVar1;
  if (n < 0xffdd) {
    if ((n < uVar1 * 2) && (n = uVar1 * 2, 0x7fed < uVar1)) {
      n = 0xffdc;
    }
  }
  else {
    n = n + 0x28;
  }
  resizestack(L,n);
  if (0xffe4 < L->stacksize) {
    lj_err_msg(L,LJ_ERR_STKOV);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_state_growstack(lua_State *L, MSize need)
{
  MSize n;
  if (L->stacksize > LJ_STACK_MAXEX)  /* Overflow while handling overflow? */
    lj_err_throw(L, LUA_ERRERR);
  n = L->stacksize + need;
  if (n > LJ_STACK_MAX) {
    n += 2*LUA_MINSTACK;
  } else if (n < 2*L->stacksize) {
    n = 2*L->stacksize;
    if (n >= LJ_STACK_MAX)
      n = LJ_STACK_MAX;
  }
  resizestack(L, n);
  if (L->stacksize > LJ_STACK_MAXEX)
    lj_err_msg(L, LJ_ERR_STKOV);
}